

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

Abc_Cex_t * Fra_SmlGetCounterExample(Fra_Sml_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  void *pvVar4;
  uint *puVar5;
  int local_3c;
  int local_38;
  int k;
  int i;
  int iBit;
  int iFrame;
  int iPo;
  uint *pSims;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pCex;
  Fra_Sml_t *p_local;
  
  if (p->fNonConstOut == 0) {
    __assert_fail("p->fNonConstOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x41b,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  k = -1;
  i = -1;
  iBit = 0;
  while( true ) {
    iVar1 = Aig_ManCoNum(p->pAig);
    iVar2 = Aig_ManRegNum(p->pAig);
    if (iVar1 - iVar2 <= iBit) break;
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iBit);
    iVar1 = Fra_SmlNodeIsZero(p,pObj_00);
    if (iVar1 == 0) {
      puVar5 = Fra_ObjSim(p,pObj_00->Id);
      local_38 = p->nWordsPref;
      goto LAB_007ab752;
    }
    iBit = iBit + 1;
  }
LAB_007ab7c4:
  iVar1 = Aig_ManCoNum(p->pAig);
  iVar2 = Aig_ManRegNum(p->pAig);
  if (iVar1 - iVar2 <= iBit) {
    __assert_fail("iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x42f,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  if (i < p->nFrames) {
    if (k < p->nWordsFrame * 0x20) {
      iVar1 = Aig_ManRegNum(p->pAig);
      iVar2 = Aig_ManCiNum(p->pAig);
      iVar3 = Aig_ManRegNum(p->pAig);
      pObj = (Aig_Obj_t *)Abc_CexAlloc(iVar1,iVar2 - iVar3,i + 1);
      (pObj->field_0).CioId = iBit;
      *(int *)((long)&pObj->field_0 + 4) = i;
      local_3c = Aig_ManCiNum(p->pAig);
      iVar1 = Aig_ManRegNum(p->pAig);
      for (local_3c = local_3c - iVar1; iVar1 = Vec_PtrSize(p->pAig->vCis), local_3c < iVar1;
          local_3c = local_3c + 1) {
        pvVar4 = Vec_PtrEntry(p->pAig->vCis,local_3c);
        puVar5 = Fra_ObjSim(p,*(int *)((long)pvVar4 + 0x24));
        iVar1 = Abc_InfoHasBit(puVar5,k);
        if (iVar1 != 0) {
          Abc_InfoSetBit((uint *)((long)&pObj->pFanin1 + 4),local_3c);
        }
      }
      for (local_38 = 0; local_38 <= i; local_38 = local_38 + 1) {
        local_3c = 0;
        while( true ) {
          iVar1 = Aig_ManCiNum(p->pAig);
          iVar2 = Aig_ManRegNum(p->pAig);
          if (iVar1 - iVar2 <= local_3c) break;
          pvVar4 = Vec_PtrEntry(p->pAig->vCis,local_3c);
          puVar5 = Fra_ObjSim(p,*(int *)((long)pvVar4 + 0x24));
          iVar1 = Abc_InfoHasBit(puVar5,p->nWordsFrame * 0x20 * local_38 + k);
          if (iVar1 != 0) {
            Abc_InfoSetBit((uint *)((long)&pObj->pFanin1 + 4),
                           *(int *)&pObj->pFanin0 + *(int *)((long)&pObj->pFanin0 + 4) * local_38 +
                           local_3c);
          }
          local_3c = local_3c + 1;
        }
      }
      iVar1 = Saig_ManVerifyCex(p->pAig,(Abc_Cex_t *)pObj);
      if (iVar1 == 0) {
        printf("Fra_SmlGetCounterExample(): Counter-example is invalid.\n");
        Abc_CexFree((Abc_Cex_t *)pObj);
        pObj = (Aig_Obj_t *)0x0;
      }
      return (Abc_Cex_t *)pObj;
    }
    __assert_fail("iBit < 32 * p->nWordsFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                  ,0x431,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  __assert_fail("iFrame < p->nFrames",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraSim.c"
                ,0x430,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
LAB_007ab752:
  if (p->nWordsTotal <= local_38) goto LAB_007ab7c4;
  if (puVar5[local_38] != 0) {
    i = local_38 / p->nWordsFrame;
    iVar1 = p->nWordsFrame;
    iVar2 = Aig_WordFindFirstBit(puVar5[local_38]);
    k = (local_38 % iVar1) * 0x20 + iVar2;
    goto LAB_007ab7c4;
  }
  local_38 = local_38 + 1;
  goto LAB_007ab752;
}

Assistant:

Abc_Cex_t * Fra_SmlGetCounterExample( Fra_Sml_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int iPo, iFrame, iBit, i, k;

    // make sure the simulation manager has it
    assert( p->fNonConstOut );

    // find the first output that failed
    iPo = -1;
    iBit = -1;
    iFrame = -1;
    Aig_ManForEachPoSeq( p->pAig, pObj, iPo )
    {
        if ( Fra_SmlNodeIsZero(p, pObj) )
            continue;
        pSims = Fra_ObjSim( p, pObj->Id );
        for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
            if ( pSims[i] )
            {
                iFrame = i / p->nWordsFrame;
                iBit = 32 * (i % p->nWordsFrame) + Aig_WordFindFirstBit( pSims[i] );
                break;
            }
        break;
    }
    assert( iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig) );
    assert( iFrame < p->nFrames );
    assert( iBit < 32 * p->nWordsFrame );

    // allocate the counter example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig), iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;

    // copy the bit data
    Aig_ManForEachLoSeq( p->pAig, pObj, k )
    {
        pSims = Fra_ObjSim( p, pObj->Id );
        if ( Abc_InfoHasBit( pSims, iBit ) )
            Abc_InfoSetBit( pCex->pData, k );
    }
    for ( i = 0; i <= iFrame; i++ )
    {
        Aig_ManForEachPiSeq( p->pAig, pObj, k )
        {
            pSims = Fra_ObjSim( p, pObj->Id );
            if ( Abc_InfoHasBit( pSims, 32 * p->nWordsFrame * i + iBit ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + pCex->nPis * i + k );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        printf( "Fra_SmlGetCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}